

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::save_to_file(CVmObjLookupTable *this,CVmFile *fp)

{
  int iVar1;
  uint i_00;
  vm_lookup_val *in_RSI;
  vm_lookup_ext *in_RDI;
  uint idx;
  char buf [12];
  vm_lookup_val *val;
  vm_lookup_val **bp;
  uint i;
  vm_lookup_ext *ext;
  vm_lookup_val *in_stack_ffffffffffffffa8;
  CVmFile *in_stack_ffffffffffffffb0;
  vm_lookup_val *val_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 auStack_32 [2];
  vm_lookup_val *local_30;
  vm_lookup_val **local_28;
  uint local_1c;
  vm_lookup_ext *local_18;
  vm_lookup_val *local_10;
  
  local_10 = in_RSI;
  local_18 = get_ext((CVmObjLookupTable *)in_RDI);
  CVmFile::write_uint2(in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  CVmFile::write_uint2(in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  val_00 = local_10;
  vm_lookup_ext::val_to_img_idx(in_RDI,local_10);
  CVmFile::write_uint2((CVmFile *)val_00,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  iVar1 = CVmObject::image_file_version_ge((CVmObject *)val_00,(char *)in_stack_ffffffffffffffa8);
  if (iVar1 != 0) {
    vmb_put_dh((char *)val_00,&in_stack_ffffffffffffffa8->key);
    CVmFile::write_bytes
              ((CVmFile *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)in_RDI,(size_t)val_00);
  }
  local_28 = local_18->buckets;
  for (local_1c = local_18->bucket_cnt; local_1c != 0; local_1c = local_1c - 1) {
    in_stack_ffffffffffffffa8 = local_10;
    vm_lookup_ext::val_to_img_idx(in_RDI,val_00);
    CVmFile::write_uint2((CVmFile *)val_00,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    local_28 = local_28 + 1;
  }
  local_1c = local_18->value_cnt;
  local_30 = vm_lookup_ext::idx_to_val(local_18,0);
  for (; local_1c != 0; local_1c = local_1c - 1) {
    vmb_put_dh((char *)val_00,&in_stack_ffffffffffffffa8->key);
    vmb_put_dh((char *)val_00,&in_stack_ffffffffffffffa8->key);
    i_00 = vm_lookup_ext::val_to_img_idx(in_RDI,val_00);
    ::oswp2(auStack_32,i_00);
    CVmFile::write_bytes
              ((CVmFile *)CONCAT44(in_stack_ffffffffffffffc4,i_00),(char *)in_RDI,(size_t)val_00);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void CVmObjLookupTable::save_to_file(VMG_ class CVmFile *fp)
{
    vm_lookup_ext *ext = get_ext();
    uint i;
    vm_lookup_val **bp;
    vm_lookup_val *val;
    char buf[VMLOOKUP_VALUE_SIZE];

    /* write our bucket count, value count, and first-free index */
    fp->write_uint2(ext->bucket_cnt);
    fp->write_uint2(ext->value_cnt);
    fp->write_uint2(ext->val_to_img_idx(ext->first_free));

    /*
     *   If the image file was compiled for version 030003 or later of the
     *   LookupTable object, save the default value.  The default value
     *   wasn't added until 030003, so source code compiled against earlier
     *   versions of the metaclass spec can't change it from the 'nil'
     *   default.  Furthermore, these image files could be loaded on VMs that
     *   have older versions of the metaclass that won't know to look for a
     *   default value in the loaded data, so to be compatible with those
     *   readers we must omit the value entirely.  If the image file was
     *   compiled with 030003 or later, it can only be loaded by VMs with
     *   LookupTable implementations that know to read the value.  
     */
    if (image_file_version_ge(vmg_ "030003"))
    {
        vmb_put_dh(buf, &ext->default_value);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }

    /* write the buckets */
    for (i = ext->bucket_cnt, bp = ext->buckets ; i != 0 ; --i, ++bp)
        fp->write_uint2(ext->val_to_img_idx(*bp));

    /* write the values */
    for (i = ext->value_cnt, val = ext->idx_to_val(0) ; i != 0 ; --i, ++val)
    {
        uint idx;
        
        /* store the key, value, and index */
        vmb_put_dh(buf, &val->key);
        vmb_put_dh(buf + VMB_DATAHOLDER, &val->val);
        idx = ext->val_to_img_idx(val->nxt);
        oswp2(buf + VMB_DATAHOLDER*2, idx);

        /* write the data */
        fp->write_bytes(buf, VMLOOKUP_VALUE_SIZE);
    }
}